

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::tryRead
          (PromisedAsyncIoStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  AsyncIoStream *pAVar1;
  Own<kj::AsyncIoStream,_std::nullptr_t> *in_R8;
  Own<kj::AsyncIoStream,_std::nullptr_t> *local_40;
  Own<kj::AsyncIoStream,_std::nullptr_t> *s;
  Own<kj::AsyncIoStream,_std::nullptr_t> *_s2380;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  PromisedAsyncIoStream *this_local;
  
  _s2380 = in_R8;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  local_40 = kj::_::readMaybe<kj::AsyncIoStream,decltype(nullptr)>
                       ((Maybe<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)((long)buffer + 0x28))
  ;
  s = local_40;
  if (local_40 == (Own<kj::AsyncIoStream,_std::nullptr_t> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&stack0xffffffffffffffb8);
    Promise<void>::
    then<kj::(anonymous_namespace)::PromisedAsyncIoStream::tryRead(void*,unsigned_long,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,(Type *)&stack0xffffffffffffffb8);
    Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffb8);
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->(local_40);
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              (this,pAVar1,minBytes_local,maxBytes_local,_s2380);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

KJ_IF_SOME(s, stream) {
      return s->tryRead(buffer, minBytes, maxBytes);
    }